

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O0

UnicodeString *
anon_unknown.dwarf_13ccb4::getPerUnitFormat
          (UnicodeString *__return_storage_ptr__,Locale *locale,UNumberUnitWidth *width,
          UErrorCode *status)

{
  UBool UVar1;
  char *pcVar2;
  UResourceBundle *pUVar3;
  UChar *text;
  StringPiece s;
  StringPiece s_00;
  StringPiece s_01;
  StringPiece s_02;
  UChar *ptr;
  undefined1 auStack_c0 [4];
  int32_t len;
  undefined4 local_b8;
  undefined1 local_b0 [12];
  undefined1 local_a0 [12];
  undefined1 local_90 [12];
  undefined1 local_80 [8];
  CharString key;
  LocalPointerBase<UResourceBundle> local_30;
  LocalUResourceBundlePointer unitsBundle;
  UErrorCode *status_local;
  UNumberUnitWidth *width_local;
  Locale *locale_local;
  
  unitsBundle.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)(LocalPointerBase<UResourceBundle>)status;
  pcVar2 = icu_63::Locale::getName(locale);
  pUVar3 = ures_open_63("icudt63l-unit",pcVar2,
                        (UErrorCode *)unitsBundle.super_LocalPointerBase<UResourceBundle>.ptr);
  icu_63::LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_30,pUVar3);
  UVar1 = ::U_FAILURE(*(UErrorCode *)unitsBundle.super_LocalPointerBase<UResourceBundle>.ptr);
  if (UVar1 == '\0') {
    icu_63::CharString::CharString((CharString *)local_80);
    icu_63::StringPiece::StringPiece((StringPiece *)local_90,"units");
    s._12_4_ = 0;
    s.ptr_ = (char *)local_90._0_8_;
    s.length_ = local_90._8_4_;
    icu_63::CharString::append
              ((CharString *)local_80,s,
               (UErrorCode *)unitsBundle.super_LocalPointerBase<UResourceBundle>.ptr);
    if (*width == UNUM_UNIT_WIDTH_NARROW) {
      icu_63::StringPiece::StringPiece((StringPiece *)local_a0,"Narrow");
      s_00._12_4_ = 0;
      s_00.ptr_ = (char *)local_a0._0_8_;
      s_00.length_ = local_a0._8_4_;
      icu_63::CharString::append
                ((CharString *)local_80,s_00,
                 (UErrorCode *)unitsBundle.super_LocalPointerBase<UResourceBundle>.ptr);
    }
    else if (*width == UNUM_UNIT_WIDTH_SHORT) {
      icu_63::StringPiece::StringPiece((StringPiece *)local_b0,"Short");
      s_01._12_4_ = 0;
      s_01.ptr_ = (char *)local_b0._0_8_;
      s_01.length_ = local_b0._8_4_;
      icu_63::CharString::append
                ((CharString *)local_80,s_01,
                 (UErrorCode *)unitsBundle.super_LocalPointerBase<UResourceBundle>.ptr);
    }
    icu_63::StringPiece::StringPiece((StringPiece *)auStack_c0,"/compound/per");
    s_02._12_4_ = 0;
    s_02.ptr_ = (char *)_auStack_c0;
    s_02.length_ = local_b8;
    icu_63::CharString::append
              ((CharString *)local_80,s_02,
               (UErrorCode *)unitsBundle.super_LocalPointerBase<UResourceBundle>.ptr);
    ptr._4_4_ = 0;
    pUVar3 = icu_63::LocalPointerBase<UResourceBundle>::getAlias(&local_30);
    pcVar2 = icu_63::CharString::data((CharString *)local_80);
    text = ures_getStringByKeyWithFallback_63
                     (pUVar3,pcVar2,(int32_t *)((long)&ptr + 4),
                      (UErrorCode *)unitsBundle.super_LocalPointerBase<UResourceBundle>.ptr);
    icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,text,ptr._4_4_);
    key.len = 1;
    icu_63::CharString::~CharString((CharString *)local_80);
  }
  else {
    icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
    key.len = 1;
  }
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString getPerUnitFormat(const Locale& locale, const UNumberUnitWidth &width, UErrorCode& status) {
    LocalUResourceBundlePointer unitsBundle(ures_open(U_ICUDATA_UNIT, locale.getName(), &status));
    if (U_FAILURE(status)) { return {}; }
    CharString key;
    key.append("units", status);
    if (width == UNUM_UNIT_WIDTH_NARROW) {
        key.append("Narrow", status);
    } else if (width == UNUM_UNIT_WIDTH_SHORT) {
        key.append("Short", status);
    }
    key.append("/compound/per", status);
    int32_t len = 0;
    const UChar* ptr = ures_getStringByKeyWithFallback(unitsBundle.getAlias(), key.data(), &len, &status);
    return UnicodeString(ptr, len);
}